

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

uint32 Clasp::StatisticObject::registerMap<Clasp::ExtendedStats>(void)

{
  int iVar1;
  
  if (registerMap<Clasp::ExtendedStats>()::vtab_s == '\0') {
    iVar1 = __cxa_guard_acquire(&registerMap<Clasp::ExtendedStats>()::vtab_s);
    if (iVar1 != 0) {
      registerMap<Clasp::ExtendedStats>::Map_T::Map_T((Map_T *)0x2065aa);
      __cxa_guard_release(&registerMap<Clasp::ExtendedStats>()::vtab_s);
    }
  }
  if (registerMap<Clasp::ExtendedStats>()::id == '\0') {
    iVar1 = __cxa_guard_acquire(&registerMap<Clasp::ExtendedStats>()::id);
    if (iVar1 != 0) {
      registerMap<Clasp::ExtendedStats>::id = registerType((I *)0x2065de);
      __cxa_guard_release(&registerMap<Clasp::ExtendedStats>()::id);
    }
  }
  return registerMap<Clasp::ExtendedStats>::id;
}

Assistant:

uint32 StatisticObject::registerMap() {
	static const struct Map_T : M {
		Map_T() : M(&Map_T::size, &Map_T::at, &Map_T::key) {}
		static inline const T* cast(ObjPtr obj) { return static_cast<const T*>(obj); }
		static uint32          size(ObjPtr obj) { return cast(obj)->size(); }
		static StatisticObject at(ObjPtr obj, const char* k) { return cast(obj)->at(k); }
		static const char*     key(ObjPtr obj, uint32 i) { return cast(obj)->key(i); }
	} vtab_s;
	static const uint32 id = registerType(&vtab_s);
	return id;
}